

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

int proxy_h2_process_pending_input(Curl_cfilter *cf,Curl_easy *data,CURLcode *err)

{
  CURLcode *pCVar1;
  Curl_easy *cf_00;
  _Bool _Var2;
  size_t sVar3;
  char *pcVar4;
  ssize_t rv;
  size_t blen;
  uchar *buf;
  cf_h2_proxy_ctx *ctx;
  CURLcode *err_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  buf = (uchar *)cf->ctx;
  ctx = (cf_h2_proxy_ctx *)err;
  err_local = &data->magic;
  data_local = (Curl_easy *)cf;
  while( true ) {
    _Var2 = Curl_bufq_peek((bufq *)(buf + 0x10),(uchar **)&blen,(size_t *)&rv);
    if (!_Var2) {
      return 0;
    }
    sVar3 = nghttp2_session_mem_recv(*(nghttp2_session **)buf,(uint8_t *)blen,rv);
    if ((((err_local != (CURLcode *)0x0) && ((*(ulong *)((long)err_local + 0xa52) >> 0x1c & 1) != 0)
         ) && (data_local != (Curl_easy *)0x0)) && (0 < *(int *)(*(long *)data_local + 0xc))) {
      Curl_trc_cf_infof((Curl_easy *)err_local,(Curl_cfilter *)data_local,
                        "[0] %zu bytes to nghttp2 -> %zd",rv,sVar3);
    }
    pCVar1 = err_local;
    if ((long)sVar3 < 0) {
      pcVar4 = nghttp2_strerror((int)sVar3);
      Curl_failf((Curl_easy *)pCVar1,
                 "process_pending_input: nghttp2_session_mem_recv() returned %zd:%s",sVar3,pcVar4);
      *(undefined4 *)&ctx->h2 = 0x38;
      return -1;
    }
    Curl_bufq_skip((bufq *)(buf + 0x10),sVar3);
    _Var2 = Curl_bufq_is_empty((bufq *)(buf + 0x10));
    cf_00 = data_local;
    pCVar1 = err_local;
    if (_Var2) break;
    if (((err_local != (CURLcode *)0x0) && ((*(ulong *)((long)err_local + 0xa52) >> 0x1c & 1) != 0))
       && ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
      sVar3 = Curl_bufq_len((bufq *)(buf + 0x10));
      Curl_trc_cf_infof((Curl_easy *)pCVar1,(Curl_cfilter *)cf_00,
                        "[0] process_pending_input: %zu bytes left in connection buffer",sVar3);
    }
  }
  if (err_local == (CURLcode *)0x0) {
    return 0;
  }
  if ((*(ulong *)((long)err_local + 0xa52) >> 0x1c & 1) == 0) {
    return 0;
  }
  if (data_local == (Curl_easy *)0x0) {
    return 0;
  }
  if (*(int *)(*(long *)data_local + 0xc) < 1) {
    return 0;
  }
  Curl_trc_cf_infof((Curl_easy *)err_local,(Curl_cfilter *)data_local,
                    "[0] all data in connection buffer processed");
  return 0;
}

Assistant:

static int proxy_h2_process_pending_input(struct Curl_cfilter *cf,
                                          struct Curl_easy *data,
                                          CURLcode *err)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  const unsigned char *buf;
  size_t blen;
  ssize_t rv;

  while(Curl_bufq_peek(&ctx->inbufq, &buf, &blen)) {

    rv = nghttp2_session_mem_recv(ctx->h2, (const uint8_t *)buf, blen);
    CURL_TRC_CF(data, cf, "[0] %zu bytes to nghttp2 -> %zd", blen, rv);
    if(rv < 0) {
      failf(data,
            "process_pending_input: nghttp2_session_mem_recv() returned "
            "%zd:%s", rv, nghttp2_strerror((int)rv));
      *err = CURLE_RECV_ERROR;
      return -1;
    }
    Curl_bufq_skip(&ctx->inbufq, (size_t)rv);
    if(Curl_bufq_is_empty(&ctx->inbufq)) {
      CURL_TRC_CF(data, cf, "[0] all data in connection buffer processed");
      break;
    }
    else {
      CURL_TRC_CF(data, cf, "[0] process_pending_input: %zu bytes left "
                  "in connection buffer", Curl_bufq_len(&ctx->inbufq));
    }
  }

  return 0;
}